

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmtmpfil.cpp
# Opt level: O0

void __thiscall CVmObjTemporaryFile::load_image_data(CVmObjTemporaryFile *this,char *ptr,size_t siz)

{
  CVmVarHeap *pCVar1;
  vm_tmpfil_ext *pvVar2;
  char *in_RDX;
  CVmObjTemporaryFile *in_RSI;
  long in_RDI;
  vm_tmpfil_ext *ext;
  
  if (*(long *)(in_RDI + 8) != 0) {
    pCVar1 = CVmMemory::get_var_heap(G_mem_X);
    (*pCVar1->_vptr_CVmVarHeap[6])(pCVar1,*(undefined8 *)(in_RDI + 8));
  }
  pvVar2 = vm_tmpfil_ext::alloc_ext(in_RSI,in_RDX);
  *(vm_tmpfil_ext **)(in_RDI + 8) = pvVar2;
  return;
}

Assistant:

void CVmObjTemporaryFile::load_image_data(VMG_ const char *ptr, size_t siz)
{
    /* free our existing extension, if we have one */
    if (ext_ != 0)
        G_mem->get_var_heap()->free_mem(ext_);
    
    /* 
     *   Allocate the extension.  A temp file object loaded from the image is
     *   invalid; these objects are inherently transient.  So simply use an
     *   empty filename to indicate that the temp file is not openable. 
     */
    vm_tmpfil_ext *ext = vm_tmpfil_ext::alloc_ext(vmg_ this, "");
    ext_ = (char *)ext;
}